

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void ctranspose(double *sig,int rows,int cols,double *col)

{
  int block;
  int c;
  int r;
  double *col_local;
  int cols_local;
  int rows_local;
  double *sig_local;
  
  if ((rows < 0x40) && (cols < 0x40)) {
    stranspose(sig,rows,cols,col);
  }
  else {
    rtranspose(sig,rows,cols,col,rows,cols);
  }
  return;
}

Assistant:

void ctranspose(double *sig, int rows, int cols,double *col) {
	int r,c;
	int block;

	block = (int) BLOCKSIZE;
	r= rows;
	c = cols;
	if (rows >= block || cols >= block)  {
		rtranspose(sig,rows,cols,col,r,c);
	} else {
		stranspose(sig,rows,cols,col);
	}
}